

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_from_range(void **param_1)

{
  roaring64_bitmap_t *r_00;
  roaring64_bitmap_t *val;
  roaring64_bitmap_t *expression;
  roaring64_bitmap_t *file;
  roaring64_bitmap_t *prVar1;
  roaring64_bitmap_t *r_5;
  roaring64_bitmap_t *r_4;
  roaring64_bitmap_t *r_3;
  roaring64_bitmap_t *r_2;
  roaring64_bitmap_t *r_1;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000060;
  roaring64_bitmap_t *in_stack_00000068;
  roaring64_bitmap_t *in_stack_00000070;
  undefined8 in_stack_ffffffffffffffc8;
  int iVar2;
  roaring64_bitmap_t *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  unsigned_long in_stack_ffffffffffffffe0;
  roaring64_bitmap_t *in_stack_ffffffffffffffe8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  roaring64_bitmap_from_range((uint64_t)r,(uint64_t)r_1,(uint64_t)r_2);
  assert_r64_valid(in_stack_ffffffffffffffd0);
  roaring64_bitmap_contains(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_free(in_stack_00000060);
  r_00 = roaring64_bitmap_from_range((uint64_t)r,(uint64_t)r_1,(uint64_t)r_2);
  assert_r64_valid(in_stack_ffffffffffffffd0);
  roaring64_bitmap_contains(r_00,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(r_00,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(r_00,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(r_00,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(r_00,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_contains(r_00,in_stack_ffffffffffffffe0);
  _assert_true(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0
               ,iVar2);
  roaring64_bitmap_free(in_stack_00000060);
  val = roaring64_bitmap_from_range((uint64_t)r,(uint64_t)r_1,(uint64_t)r_2);
  assert_r64_valid(in_stack_ffffffffffffffd0);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,iVar2)
  ;
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,iVar2)
  ;
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,iVar2)
  ;
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,iVar2)
  ;
  roaring64_bitmap_free(in_stack_00000060);
  expression = roaring64_bitmap_from_range((uint64_t)r,(uint64_t)r_1,(uint64_t)r_2);
  assert_r64_valid(in_stack_ffffffffffffffd0);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,(char *)expression,(char *)in_stack_ffffffffffffffd0,iVar2);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,(char *)expression,(char *)in_stack_ffffffffffffffd0,iVar2);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,(char *)expression,(char *)in_stack_ffffffffffffffd0,iVar2);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,(char *)expression,(char *)in_stack_ffffffffffffffd0,iVar2);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,(char *)expression,(char *)in_stack_ffffffffffffffd0,iVar2);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,(char *)expression,(char *)in_stack_ffffffffffffffd0,iVar2);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,(char *)expression,(char *)in_stack_ffffffffffffffd0,iVar2);
  roaring64_bitmap_free(in_stack_00000060);
  file = roaring64_bitmap_from_range((uint64_t)r,(uint64_t)r_1,(uint64_t)r_2);
  roaring64_bitmap_get_cardinality(in_stack_00000070);
  _assert_int_equal((unsigned_long)val,(unsigned_long)expression,(char *)file,iVar2);
  roaring64_bitmap_minimum(in_stack_00000068);
  _assert_int_equal((unsigned_long)val,(unsigned_long)expression,(char *)file,iVar2);
  roaring64_bitmap_maximum(in_stack_00000068);
  _assert_int_equal((unsigned_long)val,(unsigned_long)expression,(char *)file,iVar2);
  roaring64_bitmap_free(in_stack_00000060);
  prVar1 = roaring64_bitmap_from_range((uint64_t)r,(uint64_t)r_1,(uint64_t)r_2);
  iVar2 = (int)((ulong)prVar1 >> 0x20);
  roaring64_bitmap_contains(r_00,(uint64_t)val);
  _assert_true((unsigned_long)val,(char *)expression,(char *)file,iVar2);
  roaring64_bitmap_minimum(in_stack_00000068);
  _assert_int_equal((unsigned_long)val,(unsigned_long)expression,(char *)file,iVar2);
  roaring64_bitmap_maximum(in_stack_00000068);
  _assert_int_equal((unsigned_long)val,(unsigned_long)expression,(char *)file,iVar2);
  roaring64_bitmap_get_cardinality(in_stack_00000070);
  _assert_int_equal((unsigned_long)val,(unsigned_long)expression,(char *)file,iVar2);
  roaring64_bitmap_free(in_stack_00000060);
  return;
}

Assistant:

DEFINE_TEST(test_from_range) {
    {
        // Step greater than 2 ^ 16.
        roaring64_bitmap_t* r = roaring64_bitmap_from_range(0, 1000000, 200000);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, 0));
        assert_true(roaring64_bitmap_contains(r, 200000));
        assert_true(roaring64_bitmap_contains(r, 400000));
        assert_true(roaring64_bitmap_contains(r, 600000));
        assert_true(roaring64_bitmap_contains(r, 800000));
        assert_false(roaring64_bitmap_contains(r, 1000000));
        roaring64_bitmap_free(r);
    }
    {
        // Step less than 2 ^ 16 and within one container.
        roaring64_bitmap_t* r = roaring64_bitmap_from_range(0, 100, 20);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, 0));
        assert_true(roaring64_bitmap_contains(r, 20));
        assert_true(roaring64_bitmap_contains(r, 40));
        assert_true(roaring64_bitmap_contains(r, 60));
        assert_true(roaring64_bitmap_contains(r, 80));
        assert_false(roaring64_bitmap_contains(r, 100));
        roaring64_bitmap_free(r);
    }
    {
        // Step less than 2 ^ 16 and across two containers.
        roaring64_bitmap_t* r =
            roaring64_bitmap_from_range((1 << 16) - 1, (1 << 16) + 5, 2);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, (1 << 16) - 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 16) + 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 16) + 3));
        assert_false(roaring64_bitmap_contains(r, (1 << 16) + 5));
        roaring64_bitmap_free(r);
    }
    {
        // Step less than 2 ^ 16 and across multiple containers.
        roaring64_bitmap_t* r =
            roaring64_bitmap_from_range((1 << 16) - 1, (1 << 17) + 2, 1);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, (1 << 16) - 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 16) + 0));
        assert_true(roaring64_bitmap_contains(r, (1 << 16) + 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 17) - 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 17) + 0));
        assert_true(roaring64_bitmap_contains(r, (1 << 17) + 1));
        assert_false(roaring64_bitmap_contains(r, (1 << 17) + 2));
        roaring64_bitmap_free(r);
    }
    {
        // Range extending into the max container
        roaring64_bitmap_t* r = roaring64_bitmap_from_range(
            UINT64_MAX - 0x10000 - 10, UINT64_MAX - 0x10000 + 10, 2);
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 10);
        assert_int_equal(roaring64_bitmap_minimum(r),
                         UINT64_MAX - 0x10000 - 10);
        assert_int_equal(roaring64_bitmap_maximum(r), UINT64_MAX - 0x10000 + 8);
        roaring64_bitmap_free(r);
    }
    {
        // Range fully in the max container
        roaring64_bitmap_t* r =
            roaring64_bitmap_from_range(UINT64_MAX - 5, UINT64_MAX, 1);
        // From range is exclusive, so UINT64_MAX is not included
        assert_false(roaring64_bitmap_contains(r, UINT64_MAX));
        assert_int_equal(roaring64_bitmap_minimum(r), UINT64_MAX - 5);
        assert_int_equal(roaring64_bitmap_maximum(r), UINT64_MAX - 1);
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 5);
        roaring64_bitmap_free(r);
    }
}